

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O0

int __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[]>>>
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,float> *this,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
          *reduced_cost,int r_size,int bk_min,int bk_max)

{
  float fVar1;
  float fVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  size_type sVar6;
  int iVar7;
  solver_failure *this_00;
  type prVar8;
  reference pvVar9;
  int8_t *__first;
  iterator iVar10;
  iterator iVar11;
  size_type sVar12;
  value_type *pvVar13;
  difference_type dVar14;
  int local_124;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>_>
  local_c8;
  size_type local_c0;
  size_t e_2;
  size_t i_4;
  item *local_a8;
  item *local_a0;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>_>
  local_98;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>_>
  middle;
  int local_70;
  int e_1;
  int i_3;
  int i_2;
  size_t e;
  size_t i_1;
  int local_44;
  int local_40;
  int i;
  int local_2c;
  int local_28;
  int bk_max_local;
  int bk_min_local;
  int r_size_local;
  unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
  *reduced_cost_local;
  branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *this_local;
  
  local_2c = bk_max;
  local_28 = bk_min;
  bk_max_local = r_size;
  _bk_min_local = reduced_cost;
  reduced_cost_local =
       (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
        *)this;
  if (r_size < 4) {
    details::fail_fast("Assertion","r_size >= 4",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                       ,"453");
  }
  if (bk_max < bk_min) {
    details::fail_fast("Assertion","bk_min <= bk_max",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                       ,"454");
  }
  *(int *)(this + 0x5c) = bk_min;
  *(int *)(this + 0x60) = bk_max;
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
  ::resize((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
            *)(this + 0x20),(long)r_size);
  uVar5 = shared_subvector::init((shared_subvector *)this,(EVP_PKEY_CTX *)(ulong)(uint)bk_max_local)
  ;
  if ((uVar5 & 1) == 0) {
    this_00 = (solver_failure *)__cxa_allocate_exception(0x18);
    solver_failure::solver_failure(this_00,no_solver_available);
    __cxa_throw(this_00,&solver_failure::typeinfo,solver_failure::~solver_failure);
  }
  sVar6 = shared_subvector::emplace((shared_subvector *)this);
  *(size_type *)(this + 0x58) = sVar6;
  if (*(int *)(this + 0x58) != 0) {
    details::fail_fast("Assertion","solution == 0u",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                       ,"465");
  }
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
  ::clear((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
           *)(this + 0x38));
  for (local_40 = 0; local_40 != bk_max_local; local_40 = local_40 + 1) {
    prVar8 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
             ::operator[](_bk_min_local,(long)local_40);
    fVar1 = prVar8->value;
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20),(long)local_40);
    pvVar9->r = fVar1;
    prVar8 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
             ::operator[](_bk_min_local,(long)local_40);
    iVar7 = prVar8->id;
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20),(long)local_40);
    pvVar9->variable = iVar7;
    prVar8 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
             ::operator[](_bk_min_local,(long)local_40);
    iVar7 = prVar8->f;
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20),(long)local_40);
    pvVar9->original_factor = iVar7;
    prVar8 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
             ::operator[](_bk_min_local,(long)local_40);
    iVar7 = prVar8->f;
    if (iVar7 < 1) {
      iVar7 = -iVar7;
    }
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20),(long)local_40);
    pvVar9->factor = iVar7;
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20),(long)local_40);
    pvVar9->result = 0;
  }
  __first = shared_subvector::element_data((shared_subvector *)this,*(size_type *)(this + 0x58));
  sVar6 = shared_subvector::element_size((shared_subvector *)this);
  local_44 = 0;
  std::fill_n<signed_char*,unsigned_int,int>(__first,sVar6,&local_44);
  iVar10 = std::
           begin<std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>
                     ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                       *)(this + 0x20));
  iVar11 = std::
           end<std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>
                     ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                       *)(this + 0x20));
  std::
  sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>>
            ((__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>_>
              )iVar10._M_current,
             (__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>_>
              )iVar11._M_current);
  e = 0;
  sVar12 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
           ::size((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                   *)(this + 0x20));
  for (; e != sVar12; e = e + 1) {
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20),e);
    if (pvVar9->original_factor < 0) {
      pvVar9 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
               ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                             *)(this + 0x20),e);
      *(int *)(this + 0x5c) = pvVar9->factor + *(int *)(this + 0x5c);
      pvVar9 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
               ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                             *)(this + 0x20),e);
      *(int *)(this + 0x60) = pvVar9->factor + *(int *)(this + 0x60);
    }
  }
  pvVar9 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
           ::back((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                   *)(this + 0x20));
  fVar1 = pvVar9->r;
  pvVar9 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
           ::back((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                   *)(this + 0x20));
  pvVar9->sum_z = fVar1;
  iVar7 = length<std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>
                    ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                      *)(this + 0x20));
  for (e_1 = iVar7 + -2; -1 < e_1; e_1 = e_1 + -1) {
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20),(long)(e_1 + 1));
    fVar1 = pvVar9->sum_z;
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20),(long)e_1);
    fVar2 = pvVar9->r;
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20),(long)e_1);
    pvVar9->sum_z = fVar1 + fVar2;
  }
  if (*(int *)(this + 0x60) == *(int *)(this + 0x5c)) {
    branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::solve_equality
              ((branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *)this);
  }
  else {
    branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::solve_inequality
              ((branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *)this);
  }
  local_70 = 0;
  iVar7 = length<std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>
                    ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                      *)(this + 0x20));
  for (; local_70 != iVar7; local_70 = local_70 + 1) {
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20),(long)local_70);
    if (pvVar9->original_factor < 1) {
      pvVar13 = shared_subvector::operator[]
                          ((shared_subvector *)this,*(int *)(this + 0x58) + local_70);
      cVar3 = *pvVar13;
      pvVar9 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
               ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                             *)(this + 0x20),(long)local_70);
      pvVar9->result = (uint)(cVar3 == '\0');
    }
    else {
      pvVar13 = shared_subvector::operator[]
                          ((shared_subvector *)this,*(int *)(this + 0x58) + local_70);
      cVar3 = *pvVar13;
      pvVar9 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
               ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                             *)(this + 0x20),(long)local_70);
      pvVar9->result = (uint)(cVar3 != '\0');
    }
  }
  iVar10 = std::
           begin<std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>
                     ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                       *)(this + 0x20));
  iVar11 = std::
           end<std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>
                     ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                       *)(this + 0x20));
  std::
  sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>,baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (iVar10._M_current,iVar11._M_current);
  local_a0 = (item *)std::
                     begin<std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>
                               ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                                 *)(this + 0x20));
  local_a8 = (item *)std::
                     end<std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>
                               ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                                 *)(this + 0x20));
  local_98 = std::
             find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>,baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&)_1_>
                       (local_a0,local_a8);
  e_2 = 0;
  local_c0 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::size((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                     *)(this + 0x20));
  for (; e_2 != local_c0; e_2 = e_2 + 1) {
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20),e_2);
    fVar1 = pvVar9->r;
    prVar8 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
             ::operator[](_bk_min_local,e_2);
    prVar8->value = fVar1;
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20),e_2);
    iVar7 = pvVar9->variable;
    prVar8 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
             ::operator[](_bk_min_local,e_2);
    prVar8->id = iVar7;
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20),e_2);
    iVar7 = pvVar9->original_factor;
    prVar8 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
             ::operator[](_bk_min_local,e_2);
    prVar8->f = iVar7;
  }
  local_c8._M_current =
       (item *)std::
               end<std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>
                         ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20));
  bVar4 = __gnu_cxx::
          operator==<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>_>
                    (&local_98,&local_c8);
  if (bVar4) {
    pvVar9 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
             ::operator[]((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                           *)(this + 0x20),0);
    if (pvVar9->result == 0) {
      local_124 = -1;
    }
    else {
      local_124 = bk_max_local;
    }
    this_local._4_4_ = local_124;
  }
  else {
    iVar10 = std::
             begin<std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>
                       ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                         *)(this + 0x20));
    dVar14 = std::
             distance<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>>
                       ((__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>_>
                         )iVar10._M_current,local_98);
    this_local._4_4_ = (int)dVar14 + -1;
  }
  return this_local._4_4_;
}

Assistant:

int solve(R& reduced_cost, int r_size, int bk_min, int bk_max)
    {
        bx_assert(r_size >= 4);
        bx_assert(bk_min <= bk_max);

        b_min = bk_min;
        b_max = bk_max;

        items.resize(r_size);
        if (!subvector.init(r_size))
            throw solver_failure(solver_error_tag::no_solver_available);

        solution = subvector.emplace();

        bx_assert(solution == 0u);

        nodes.clear();

        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].original_factor = reduced_cost[i].f;
            items[i].factor = std::abs(reduced_cost[i].f);
            items[i].result = 0;
        }

        std::fill_n(
          subvector.element_data(solution), subvector.element_size(), 0);

        std::sort(std::begin(items), std::end(items));

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            if (items[i].original_factor < 0) {
                b_min += items[i].factor;
                b_max += items[i].factor;
            }
        }

        // Compute the inversion of the sum z
        items.back().sum_z = items.back().r;
        for (int i = length(items) - 2; i >= 0; --i)
            items[i].sum_z = items[i + 1].sum_z + items[i].r;

        if (b_max == b_min)
            solve_equality();
        else
            solve_inequality();

        for (int i = 0, e = length(items); i != e; ++i) {
            if (items[i].original_factor > 0)
                items[i].result = subvector[solution + i] == 0 ? 0 : 1;
            else
                items[i].result = subvector[solution + i] == 0 ? 1 : 0;
        }

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].original_factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }